

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O2

bool __thiscall
crnlib::command_line_params::parse
          (command_line_params *this,char *pCmd_line,uint n,param_desc *pParam_desc,
          bool skip_first_param)

{
  bool bVar1;
  dynamic_string_array p;
  dynamic_string_array local_38;
  
  local_38.m_p = (dynamic_string *)0x0;
  local_38.m_size = 0;
  local_38.m_capacity = 0;
  bVar1 = split_params(pCmd_line,&local_38);
  if (bVar1 && local_38.m_size != 0) {
    if (skip_first_param) {
      vector<crnlib::dynamic_string>::erase(&local_38,0);
    }
    bVar1 = parse(this,&local_38,n,pParam_desc);
  }
  else {
    bVar1 = false;
  }
  vector<crnlib::dynamic_string>::~vector(&local_38);
  return bVar1;
}

Assistant:

bool command_line_params::parse(const char* pCmd_line, uint n, const param_desc* pParam_desc, bool skip_first_param) {
  CRNLIB_ASSERT(n && pParam_desc);

  dynamic_string_array p;
  if (!split_params(pCmd_line, p))
    return 0;

  if (p.empty())
    return 0;

  if (skip_first_param)
    p.erase(0U);

  return parse(p, n, pParam_desc);
}